

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::Type::BrandParameter> * __thiscall
capnp::Type::getBrandParameter
          (Maybe<capnp::Type::BrandParameter> *__return_storage_ptr__,Type *this)

{
  bool bVar1;
  anon_union_8_2_eba6ea51_for_Type_5 local_40;
  uint local_38;
  Fault local_20;
  Fault f;
  Type *this_local;
  
  f.exception = (Exception *)this;
  bVar1 = isAnyPointer(this);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x330,FAILED,"isAnyPointer()",
               "\"Type::getBrandParameter() can only be called on AnyPointer types.\"",
               (char (*) [66])"Type::getBrandParameter() can only be called on AnyPointer types.");
    kj::_::Debug::Fault::fatal(&local_20);
  }
  if ((this->field_4).schema == (RawBrandedSchema *)0x0) {
    kj::Maybe<capnp::Type::BrandParameter>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    local_40 = this->field_4;
    local_38 = (uint)(this->field_3).paramIndex;
    kj::Maybe<capnp::Type::BrandParameter>::Maybe
              (__return_storage_ptr__,(BrandParameter *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type::BrandParameter> Type::getBrandParameter() const {
  KJ_REQUIRE(isAnyPointer(), "Type::getBrandParameter() can only be called on AnyPointer types.");

  if (scopeId == 0) {
    return nullptr;
  } else {
    return BrandParameter { scopeId, paramIndex };
  }
}